

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::ClearActiveBPInfo
          (ExecutionInfoManager *this,ThreadContextTTD *ttdThreadContext)

{
  StatementLocation statement_00;
  bool bVar1;
  TTD_LOG_PTR_ID ctxId;
  ScriptContext *inCtx;
  FunctionBody *this_00;
  Utf8SourceInfo *this_01;
  undefined1 local_48 [8];
  StatementLocation statement;
  DebugDocument *debugDocument;
  FunctionBody *body;
  ScriptContext *ctx;
  ThreadContextTTD *ttdThreadContext_local;
  ExecutionInfoManager *this_local;
  
  bVar1 = TTDebuggerSourceLocation::HasValue(&this->m_activeTTDBP);
  if (bVar1) {
    ctxId = TTDebuggerSourceLocation::GetScriptLogTagId(&this->m_activeTTDBP);
    inCtx = ThreadContextTTD::LookupContextForScriptId(ttdThreadContext,ctxId);
    this_00 = TTDebuggerSourceLocation::LoadFunctionBodyIfPossible(&this->m_activeTTDBP,inCtx);
    this_01 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this_00);
    statement.bytecodeSpan = (Interval)Js::Utf8SourceInfo::GetDebugDocument(this_01);
    Js::StatementLocation::StatementLocation((StatementLocation *)local_48);
    if (((this->m_shouldRemoveWhenDone & 1U) != 0) &&
       (bVar1 = Js::DebugDocument::FindBPStatementLocation
                          ((DebugDocument *)statement.bytecodeSpan,(UINT)this->m_activeBPId,
                           (StatementLocation *)local_48), bVar1)) {
      statement_00.statement = (Interval)statement.function;
      statement_00.function = (FunctionBody *)local_48;
      statement_00.bytecodeSpan = statement.statement;
      Js::DebugDocument::SetBreakPoint
                ((DebugDocument *)statement.bytecodeSpan,statement_00,BREAKPOINT_DELETED);
    }
    this->m_activeBPId = -1;
    this->m_shouldRemoveWhenDone = false;
    TTDebuggerSourceLocation::Clear(&this->m_activeTTDBP);
    return;
  }
  TTDAbort_unrecoverable_error("Need to check that we actually have info to clear first.");
}

Assistant:

void ExecutionInfoManager::ClearActiveBPInfo(ThreadContextTTD* ttdThreadContext)
    {
        TTDAssert(this->m_activeTTDBP.HasValue(), "Need to check that we actually have info to clear first.");

        Js::ScriptContext* ctx = ttdThreadContext->LookupContextForScriptId(this->m_activeTTDBP.GetScriptLogTagId());
        Js::FunctionBody* body = this->m_activeTTDBP.LoadFunctionBodyIfPossible(ctx);

        Js::DebugDocument* debugDocument = body->GetUtf8SourceInfo()->GetDebugDocument();
        Js::StatementLocation statement;
        if(this->m_shouldRemoveWhenDone && debugDocument->FindBPStatementLocation((UINT)this->m_activeBPId, &statement))
        {
            debugDocument->SetBreakPoint(statement, BREAKPOINT_DELETED);
        }

        this->m_activeBPId = -1;
        this->m_shouldRemoveWhenDone = false;
        this->m_activeTTDBP.Clear();
    }